

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

int INT_EVdfg_unlink_port(EVdfg_stone src,int port)

{
  int in_ESI;
  EVdfg_config_action act;
  int in_stack_000000f4;
  EVdfg_configuration in_stack_000000f8;
  undefined1 in_stack_00000110 [32];
  undefined4 local_4;
  
  if (in_ESI < 0) {
    local_4 = 0;
  }
  else {
    local_4 = EVdfg_perform_act_on_state
                        (in_stack_000000f8,(EVdfg_config_action)in_stack_00000110,in_stack_000000f4)
    ;
  }
  return local_4;
}

Assistant:

extern int
INT_EVdfg_unlink_port(EVdfg_stone src, int port)
{
    EVdfg_config_action act;
    if (port < 0) return 0;
    act.type = ACT_unlink_port;
    act.stone_id = src->stone_id;
    act.u.link.port = port;
    return EVdfg_perform_act_on_state(src->dfg->working_state, act, 1 /* add to queue */);
}